

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_8x32_impl.h
# Opt level: O0

void secp256k1_scalar_get_b32(uchar *bin,secp256k1_scalar *a)

{
  secp256k1_scalar *a_local;
  uchar *bin_local;
  
  *bin = (uchar)(a->d[7] >> 0x18);
  bin[1] = (uchar)(a->d[7] >> 0x10);
  bin[2] = (uchar)(a->d[7] >> 8);
  bin[3] = (uchar)a->d[7];
  bin[4] = (uchar)(a->d[6] >> 0x18);
  bin[5] = (uchar)(a->d[6] >> 0x10);
  bin[6] = (uchar)(a->d[6] >> 8);
  bin[7] = (uchar)a->d[6];
  bin[8] = (uchar)(a->d[5] >> 0x18);
  bin[9] = (uchar)(a->d[5] >> 0x10);
  bin[10] = (uchar)(a->d[5] >> 8);
  bin[0xb] = (uchar)a->d[5];
  bin[0xc] = (uchar)(a->d[4] >> 0x18);
  bin[0xd] = (uchar)(a->d[4] >> 0x10);
  bin[0xe] = (uchar)(a->d[4] >> 8);
  bin[0xf] = (uchar)a->d[4];
  bin[0x10] = (uchar)(a->d[3] >> 0x18);
  bin[0x11] = (uchar)(a->d[3] >> 0x10);
  bin[0x12] = (uchar)(a->d[3] >> 8);
  bin[0x13] = (uchar)a->d[3];
  bin[0x14] = (uchar)(a->d[2] >> 0x18);
  bin[0x15] = (uchar)(a->d[2] >> 0x10);
  bin[0x16] = (uchar)(a->d[2] >> 8);
  bin[0x17] = (uchar)a->d[2];
  bin[0x18] = (uchar)(a->d[1] >> 0x18);
  bin[0x19] = (uchar)(a->d[1] >> 0x10);
  bin[0x1a] = (uchar)(a->d[1] >> 8);
  bin[0x1b] = (uchar)a->d[1];
  bin[0x1c] = (uchar)(a->d[0] >> 0x18);
  bin[0x1d] = (uchar)(a->d[0] >> 0x10);
  bin[0x1e] = (uchar)(a->d[0] >> 8);
  bin[0x1f] = (uchar)a->d[0];
  return;
}

Assistant:

static void secp256k1_scalar_get_b32(unsigned char *bin, const secp256k1_scalar* a) {
    bin[0] = a->d[7] >> 24; bin[1] = a->d[7] >> 16; bin[2] = a->d[7] >> 8; bin[3] = a->d[7];
    bin[4] = a->d[6] >> 24; bin[5] = a->d[6] >> 16; bin[6] = a->d[6] >> 8; bin[7] = a->d[6];
    bin[8] = a->d[5] >> 24; bin[9] = a->d[5] >> 16; bin[10] = a->d[5] >> 8; bin[11] = a->d[5];
    bin[12] = a->d[4] >> 24; bin[13] = a->d[4] >> 16; bin[14] = a->d[4] >> 8; bin[15] = a->d[4];
    bin[16] = a->d[3] >> 24; bin[17] = a->d[3] >> 16; bin[18] = a->d[3] >> 8; bin[19] = a->d[3];
    bin[20] = a->d[2] >> 24; bin[21] = a->d[2] >> 16; bin[22] = a->d[2] >> 8; bin[23] = a->d[2];
    bin[24] = a->d[1] >> 24; bin[25] = a->d[1] >> 16; bin[26] = a->d[1] >> 8; bin[27] = a->d[1];
    bin[28] = a->d[0] >> 24; bin[29] = a->d[0] >> 16; bin[30] = a->d[0] >> 8; bin[31] = a->d[0];
}